

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QRect __thiscall QDockAreaLayout::constrainedRect(QDockAreaLayout *this,QRect rect,QWidget *widget)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar14;
  ulong uVar15;
  int iVar16;
  long in_FS_OFFSET;
  undefined1 auVar17 [16];
  QRect QVar18;
  QPoint local_48 [2];
  ulong local_38;
  long local_30;
  ulong uVar13;
  
  uVar6 = rect._0_8_;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QGuiApplication::primaryScreen();
  QScreen::virtualSiblings();
  if (local_48[0] != (QPoint)0x0) {
    LOCK();
    *(int *)local_48[0] = *(int *)local_48[0] + -1;
    UNLOCK();
    if (*(int *)local_48[0] == 0) {
      QArrayData::deallocate((QArrayData *)local_48[0],8,0x10);
    }
  }
  if (local_38 < 2) {
    lVar3 = 0;
  }
  else {
    local_48[0] = (QPoint)this;
    lVar3 = QGuiApplication::screenAt(local_48);
  }
  uVar13 = (ulong)this >> 0x20;
  iVar12 = (int)((ulong)this >> 0x20);
  if (lVar3 == 0) {
    QWidget::screen(rect._8_8_);
  }
  auVar17 = QScreen::geometry();
  iVar1 = auVar17._0_4_;
  iVar5 = auVar17._8_4_;
  iVar4 = auVar17._4_4_;
  uVar9 = auVar17._8_8_ >> 0x20;
  iVar8 = auVar17._12_4_;
  uVar15 = uVar6 >> 0x20;
  if (iVar4 <= iVar8 && iVar1 <= iVar5) {
    iVar7 = (int)this;
    iVar16 = (rect.x1.m_i.m_i - iVar7) + 1;
    iVar10 = (iVar5 - iVar1) + 1;
    if (iVar16 < iVar10) {
      iVar10 = iVar16;
    }
    iVar14 = (rect.y1.m_i.m_i - iVar12) + 1;
    iVar16 = (iVar8 - iVar4) + 1;
    if (iVar14 < iVar16) {
      iVar16 = iVar14;
    }
    if (iVar7 <= iVar1) {
      iVar7 = iVar1;
    }
    uVar2 = (iVar7 + iVar10) - 1;
    if (iVar4 < iVar12) {
      iVar4 = iVar12;
    }
    uVar11 = (iVar4 + iVar16) - 1;
    uVar6 = auVar17._8_8_ & 0xffffffff;
    if ((int)uVar2 < iVar5) {
      uVar6 = (ulong)uVar2;
    }
    this = (QDockAreaLayout *)(ulong)((iVar7 - uVar2) + (int)uVar6);
    if ((int)uVar11 < iVar8) {
      uVar9 = (ulong)uVar11;
    }
    uVar13 = (ulong)((iVar4 - uVar11) + (int)uVar9);
    uVar15 = uVar9;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QVar18._0_8_ = (ulong)this & 0xffffffff | uVar13 << 0x20;
    QVar18._8_8_ = uVar6 & 0xffffffff | uVar15 << 0x20;
    return QVar18;
  }
  __stack_chk_fail();
}

Assistant:

QRect QDockAreaLayout::constrainedRect(QRect rect, QWidget* widget)
{
    QScreen *screen = nullptr;
    if (QGuiApplication::primaryScreen()->virtualSiblings().size() > 1)
        screen = QGuiApplication::screenAt(rect.topLeft());
    if (!screen)
        screen = widget->screen();

    const QRect screenRect = screen->geometry();
    if (screenRect.isValid()) {
        rect.setWidth(qMin(rect.width(), screenRect.width()));
        rect.setHeight(qMin(rect.height(), screenRect.height()));
        rect.moveLeft(qMax(rect.left(), screenRect.left()));
        rect.moveTop(qMax(rect.top(), screenRect.top()));
        rect.moveRight(qMin(rect.right(), screenRect.right()));
        rect.moveBottom(qMin(rect.bottom(), screenRect.bottom()));
    }

    return rect;
}